

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O1

void blend_a64_mask_b10_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  long lVar3;
  undefined1 in_XMM0 [16];
  undefined1 auVar4 [16];
  undefined1 in_XMM2 [16];
  uint16_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  
  auVar4 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    if (0 < w) {
      lVar3 = 0;
      do {
        in_XMM2 = pmovzxbw(in_XMM2,*(undefined8 *)(mask + lVar3));
        puVar1 = src0 + lVar3;
        puVar2 = src1 + lVar3;
        uVar5 = pavgw((ushort)(*puVar1 * in_XMM2._0_2_ + *puVar2 * (auVar4._0_2_ - in_XMM2._0_2_))
                      >> 5,0);
        uVar6 = pavgw((ushort)(puVar1[1] * in_XMM2._2_2_ +
                              puVar2[1] * (auVar4._2_2_ - in_XMM2._2_2_)) >> 5,0);
        uVar7 = pavgw((ushort)(puVar1[2] * in_XMM2._4_2_ +
                              puVar2[2] * (auVar4._4_2_ - in_XMM2._4_2_)) >> 5,0);
        uVar8 = pavgw((ushort)(puVar1[3] * in_XMM2._6_2_ +
                              puVar2[3] * (auVar4._6_2_ - in_XMM2._6_2_)) >> 5,0);
        uVar9 = pavgw((ushort)(puVar1[4] * in_XMM2._8_2_ +
                              puVar2[4] * (auVar4._8_2_ - in_XMM2._8_2_)) >> 5,0);
        uVar10 = pavgw((ushort)(puVar1[5] * in_XMM2._10_2_ +
                               puVar2[5] * (auVar4._10_2_ - in_XMM2._10_2_)) >> 5,0);
        uVar11 = pavgw((ushort)(puVar1[6] * in_XMM2._12_2_ +
                               puVar2[6] * (auVar4._12_2_ - in_XMM2._12_2_)) >> 5,0);
        uVar12 = pavgw((ushort)(puVar1[7] * in_XMM2._14_2_ +
                               puVar2[7] * (auVar4._14_2_ - in_XMM2._14_2_)) >> 5,0);
        puVar1 = dst + lVar3;
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        puVar1[2] = uVar7;
        puVar1[3] = uVar8;
        puVar1[4] = uVar9;
        puVar1[5] = uVar10;
        puVar1[6] = uVar11;
        puVar1[7] = uVar12;
        lVar3 = lVar3 + 8;
      } while ((int)lVar3 < w);
    }
    mask = mask + mask_stride;
    dst = dst + dst_stride;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b10_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  blend_a64_mask_bn_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                               src1_stride, mask, mask_stride, w, h,
                               blend_8_b10);
}